

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithConstr(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vSuper_00;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  bool bVar6;
  int local_4c;
  int local_48;
  int LevelBest;
  int iLitBest;
  int iLit;
  int iDriver;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vSuper;
  Gia_Man_t *p_local;
  
  local_48 = -1;
  local_4c = -1;
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfa,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfb,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  _iDriver = Gia_ManPo(p,0);
  iVar1 = Gia_ObjFaninC0(_iDriver);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjFaninId0p(p,_iDriver);
    if (iVar1 == 0) {
      printf("The miter\'s output is a constant.\n");
      p_local = (Gia_Man_t *)0x0;
    }
    else {
      vSuper_00 = Vec_IntAlloc(100);
      pGVar4 = Gia_ObjChild0(_iDriver);
      Gia_ManDupWithConstrCollectAnd_rec(p,pGVar4,vSuper_00,1);
      iVar1 = Vec_IntSize(vSuper_00);
      if (iVar1 < 2) {
        __assert_fail("Vec_IntSize(vSuper) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0xc09,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
      }
      Gia_ManLevelNum(p);
      for (iLit = 0; iVar1 = Vec_IntSize(vSuper_00), iLit < iVar1; iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(vSuper_00,iLit);
        iVar2 = Abc_Lit2Var(iVar1);
        iVar2 = Gia_ObjLevelId(p,iVar2);
        if (local_4c < iVar2) {
          iVar2 = Abc_Lit2Var(iVar1);
          local_4c = Gia_ObjLevelId(p,iVar2);
          local_48 = iVar1;
        }
      }
      if (local_48 == -1) {
        __assert_fail("iLitBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0xc0f,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
      }
      iVar1 = Gia_ManObjNum(p);
      p_00 = Gia_ManStart(iVar1);
      pcVar5 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar5;
      pcVar5 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar5;
      pGVar4 = Gia_ManConst0(p);
      pGVar4->Value = 0;
      Gia_ManHashAlloc(p_00);
      iLit = 1;
      while( true ) {
        bVar6 = false;
        if (iLit < p->nObjs) {
          _iDriver = Gia_ManObj(p,iLit);
          bVar6 = _iDriver != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar1 = Gia_ObjIsAnd(_iDriver);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCi(_iDriver);
          if (iVar1 != 0) {
            uVar3 = Gia_ManAppendCi(p_00);
            _iDriver->Value = uVar3;
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_iDriver);
          iVar2 = Gia_ObjFanin1Copy(_iDriver);
          uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
          _iDriver->Value = uVar3;
        }
        iLit = iLit + 1;
      }
      iLitBest = -1;
      for (iLit = 0; iVar1 = Vec_IntSize(vSuper_00), iLit < iVar1; iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(vSuper_00,iLit);
        if (iVar1 != local_48) {
          if (iLitBest == -1) {
            iLitBest = Gia_ObjLitCopy(p,iVar1);
          }
          else {
            iVar1 = Gia_ObjLitCopy(p,iVar1);
            iLitBest = Gia_ManHashAnd(p_00,iLitBest,iVar1);
          }
        }
      }
      iVar1 = Gia_ObjLitCopy(p,local_48);
      Gia_ManAppendCo(p_00,iVar1);
      iVar1 = Abc_LitNot(iLitBest);
      Gia_ManAppendCo(p_00,iVar1);
      p_00->nConstrs = 1;
      p_local = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      Vec_IntFree(vSuper_00);
    }
  }
  else {
    printf("The miter\'s output is not AND-decomposable.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstr( Gia_Man_t * p )
{
    Vec_Int_t * vSuper;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iDriver, iLit, iLitBest = -1, LevelBest = -1;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) == 0 );
    pObj = Gia_ManPo( p, 0 );
    if ( Gia_ObjFaninC0(pObj) )
    {
        printf( "The miter's output is not AND-decomposable.\n" );
        return NULL;
    }
    if ( Gia_ObjFaninId0p(p, pObj) == 0 )
    {
        printf( "The miter's output is a constant.\n" );
        return NULL;
    }
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // find the highest level
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        if ( LevelBest < Gia_ObjLevelId(p, Abc_Lit2Var(iLit)) )
            LevelBest = Gia_ObjLevelId(p, Abc_Lit2Var(iLit)), iLitBest = iLit;
    assert( iLitBest != -1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create AND of nodes
    iDriver = -1;
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        if ( iLit == iLitBest )
            continue;
        if ( iDriver == -1 )
            iDriver = Gia_ObjLitCopy(p, iLit);
        else
            iDriver = Gia_ManHashAnd( pNew, iDriver, Gia_ObjLitCopy(p, iLit) );
    }
    // create the main PO
    Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, iLitBest) );
    // create the constraint PO
    Gia_ManAppendCo( pNew, Abc_LitNot(iDriver) );
    pNew->nConstrs = 1;
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    return pNew;

}